

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

char * stringify(char *str,VARR_char *to)

{
  char obj;
  char *pcVar1;
  
  VARR_chartrunc(to,0);
  VARR_charpush(to,'\"');
  do {
    obj = *str;
    if ((obj == '\"') || (obj == '\\')) {
      VARR_charpush(to,'\\');
      obj = *str;
    }
    else if (obj == '\0') {
      VARR_charpush(to,'\"');
      pcVar1 = VARR_charaddr(to);
      return pcVar1;
    }
    VARR_charpush(to,obj);
    str = str + 1;
  } while( true );
}

Assistant:

static const char *stringify (const char *str, VARR (char) * to) {
  VARR_TRUNC (char, to, 0);
  VARR_PUSH (char, to, '"');
  for (; *str != '\0'; str++) {
    if (*str == '\"' || *str == '\\') VARR_PUSH (char, to, '\\');
    VARR_PUSH (char, to, *str);
  }
  VARR_PUSH (char, to, '"');
  return VARR_ADDR (char, to);
}